

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test10::verifyResults
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex)

{
  ostringstream *poVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  GLuint GVar6;
  deUint32 dVar7;
  _variable_type _Var8;
  GLuint GVar9;
  GLuint GVar10;
  uint uVar11;
  undefined4 extraout_var;
  long lVar13;
  GLuint result_00;
  ulong uVar14;
  GLuint result;
  uint uVar15;
  GPUShaderFP64Test10 *this_00;
  undefined1 local_1b0 [384];
  long lVar12;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  uVar5 = (*function_object->_vptr_functionObject[5])(function_object);
  GVar6 = functionObject::getResultStride(function_object);
  puVar2 = (this->m_expected_results_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (**(code **)(lVar12 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba2);
  lVar13 = (**(code **)(lVar12 + 0xcf8))(0x8c8e,35000);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3ba5);
  uVar14 = 0;
  do {
    result_00 = (GLuint)uVar14;
    if (uVar5 == result_00) {
      (**(code **)(lVar12 + 0x1670))(0x8c8e);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3bb8);
      goto LAB_009f1b88;
    }
    _Var8 = (*function_object->_vptr_functionObject[6])(function_object,uVar14);
    this_00 = (GPUShaderFP64Test10 *)function_object;
    GVar9 = functionObject::getResultOffset(function_object,result_00);
    bVar3 = compare(this_00,_Var8,puVar2 + (ulong)GVar9 + (ulong)(GVar6 * vertex),
                    (GLvoid *)((ulong)GVar9 + lVar13));
    uVar14 = (ulong)(result_00 + 1);
  } while (bVar3);
  (**(code **)(lVar12 + 0x1670))(0x8c8e);
  dVar7 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar7,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3bb8);
  GVar9 = functionObject::getArgumentStride(function_object);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Error. Invalid result.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Function: ");
  std::operator<<((ostream *)poVar1,function_object->m_function_name);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
    _Var8 = (*function_object->_vptr_functionObject[6])(function_object,(ulong)uVar15);
    GVar10 = functionObject::getResultOffset(function_object,uVar15);
    logVariableType(this,(GLvoid *)((ulong)GVar10 + lVar13),"Result",_Var8);
    logVariableType(this,puVar2 + (ulong)GVar10 + (ulong)(GVar6 * vertex),"Expected result",_Var8);
  }
  uVar15 = 0;
  while( true ) {
    uVar11 = (*function_object->_vptr_functionObject[3])(function_object);
    if (uVar11 <= uVar15) break;
    GVar6 = functionObject::getArgumentOffset(function_object,uVar15);
    puVar2 = (this->m_argument_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var8 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)uVar15);
    logVariableType(this,puVar2 + (GVar6 + GVar9 * vertex),"Argument",_Var8);
    uVar15 = uVar15 + 1;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Shader:\n");
  std::operator<<((ostream *)poVar1,(string *)&this->m_vertex_shader_code);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
LAB_009f1b88:
  return uVar5 <= result_00;
}

Assistant:

bool GPUShaderFP64Test10::verifyResults(const functionObject& function_object, glw::GLuint vertex)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  test_result	  = true;
	const glw::GLuint	 n_results		   = function_object.getResultCount();
	const glw::GLuint	 results_stride   = function_object.getResultStride();
	const glw::GLuint	 results_offset   = vertex * results_stride;
	const glw::GLubyte*   expected_results = &m_expected_results_data[results_offset];

	/* Get transform feedback data */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	glw::GLubyte* feedback_data = (glw::GLubyte*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		const Utils::_variable_type result_type   = function_object.getResultType(result);
		const glw::GLuint			result_offset = function_object.getResultOffset(result);

		const glw::GLvoid* expected_result_src = expected_results + result_offset;
		const glw::GLvoid* result_src		   = feedback_data + result_offset;

		if (false == compare(result_type, expected_result_src, result_src))
		{
			test_result = false;
			break;
		}
	}

	/* Unmap transform feedback buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	if (false == test_result)
	{
		const glw::GLuint argument_stride  = function_object.getArgumentStride();
		const glw::GLuint arguments_offset = vertex * argument_stride;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function: " << function_object.getName()
											<< tcu::TestLog::EndMessage;

		for (glw::GLuint result = 0; result < n_results; ++result)
		{
			const Utils::_variable_type result_type   = function_object.getResultType(result);
			const glw::GLuint			result_offset = function_object.getResultOffset(result);

			const glw::GLvoid* expected_result_src = expected_results + result_offset;
			const glw::GLvoid* result_src		   = feedback_data + result_offset;

			logVariableType(result_src, "Result", result_type);
			logVariableType(expected_result_src, "Expected result", result_type);
		}

		for (glw::GLuint argument = 0; argument < function_object.getArgumentCount(); ++argument)
		{
			const glw::GLuint   argument_offset = function_object.getArgumentOffset(argument);
			const glw::GLubyte* argument_src	= &m_argument_data[arguments_offset + argument_offset];

			logVariableType(argument_src, "Argument", function_object.getArgumentType(argument));
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader:\n"
											<< m_vertex_shader_code << tcu::TestLog::EndMessage;
	}

	return test_result;
}